

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * testing::internal::UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_(void)

{
  char *__s;
  long lVar1;
  long *__s_00;
  char *pcVar2;
  size_t sVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  size_type sVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  string *in_RDI;
  _Alloc_hider _Var9;
  FilePath output_name;
  FilePath result;
  string format;
  string s;
  allocator<char> local_191;
  FilePath local_190;
  FilePath local_170;
  FilePath local_150;
  FilePath local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  long local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  long *local_70;
  long local_68;
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,FLAGS_gtest_output_abi_cxx11_,
             DAT_004f1b60 + FLAGS_gtest_output_abi_cxx11_);
  __s_00 = local_50[0];
  GetOutputFormat_abi_cxx11_();
  if (local_68 == 0) {
    paVar4 = &local_190.pathname_.field_2;
    local_190.pathname_._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"xml","");
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_190);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190.pathname_._M_dataplus._M_p != paVar4) {
      operator_delete(local_190.pathname_._M_dataplus._M_p,
                      local_190.pathname_.field_2._M_allocated_capacity + 1);
    }
  }
  pcVar2 = strchr((char *)__s_00,0x3a);
  if (pcVar2 == (char *)0x0) {
    UnitTest::GetInstance();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,
               ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
               _M_dataplus._M_p,(allocator<char> *)&local_130);
    sVar5 = local_a8;
    paVar4 = &local_150.pathname_.field_2;
    local_150.pathname_._M_dataplus._M_p = (pointer)paVar4;
    if (local_b0 == &local_a0) {
      local_150.pathname_.field_2._8_4_ = local_a0._8_4_;
      local_150.pathname_.field_2._12_4_ = local_a0._12_4_;
    }
    else {
      local_150.pathname_._M_dataplus._M_p = (pointer)local_b0;
    }
    local_150.pathname_.field_2._M_allocated_capacity._4_4_ = local_a0._M_allocated_capacity._4_4_;
    local_150.pathname_.field_2._M_allocated_capacity._0_4_ = local_a0._M_allocated_capacity._0_4_;
    local_150.pathname_._M_string_length = local_a8;
    local_b0 = &local_a0;
    local_a8 = 0;
    local_a0._M_allocated_capacity._0_4_ = local_a0._M_allocated_capacity._0_4_ & 0xffffff00;
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_150.pathname_._M_dataplus._M_p;
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_150.pathname_._M_dataplus._M_p;
    if (sVar5 != 0) {
      do {
        if ((paVar6 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_150.pathname_._M_dataplus._M_p || paVar7->_M_local_buf[0] != '/') ||
           (paVar6->_M_local_buf[-1] != '/')) {
          paVar6->_M_local_buf[0] = paVar7->_M_local_buf[0];
          paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(paVar6->_M_local_buf + 1);
          sVar5 = local_150.pathname_._M_string_length;
        }
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(paVar7->_M_local_buf + 1);
      } while (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(local_150.pathname_._M_dataplus._M_p + sVar5));
    }
    local_150.pathname_._M_string_length = (long)paVar6 - (long)local_150.pathname_._M_dataplus._M_p
    ;
    paVar6->_M_local_buf[0] = '\0';
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"test_detail","");
    sVar5 = local_e8;
    paVar6 = &local_170.pathname_.field_2;
    local_170.pathname_._M_dataplus._M_p = (pointer)paVar6;
    if (local_f0 == &local_e0) {
      local_170.pathname_.field_2._8_8_ = local_e0._8_8_;
    }
    else {
      local_170.pathname_._M_dataplus._M_p = (pointer)local_f0;
    }
    local_170.pathname_.field_2._M_allocated_capacity._1_7_ = local_e0._M_allocated_capacity._1_7_;
    local_170.pathname_.field_2._M_local_buf[0] = local_e0._M_local_buf[0];
    local_170.pathname_._M_string_length = local_e8;
    local_f0 = &local_e0;
    local_e8 = 0;
    local_e0._M_local_buf[0] = '\0';
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_170.pathname_._M_dataplus._M_p;
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_170.pathname_._M_dataplus._M_p;
    if (sVar5 != 0) {
      do {
        if ((paVar7 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_170.pathname_._M_dataplus._M_p || paVar8->_M_local_buf[0] != '/') ||
           (paVar7->_M_local_buf[-1] != '/')) {
          paVar7->_M_local_buf[0] = paVar8->_M_local_buf[0];
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(paVar7->_M_local_buf + 1);
          sVar5 = local_170.pathname_._M_string_length;
        }
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(paVar8->_M_local_buf + 1);
      } while (paVar8 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(local_170.pathname_._M_dataplus._M_p + sVar5));
    }
    local_170.pathname_._M_string_length = (long)paVar7 - (long)local_170.pathname_._M_dataplus._M_p
    ;
    paVar7->_M_local_buf[0] = '\0';
    FilePath::MakeFileName(&local_190,&local_150,&local_170,0,(char *)local_70);
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    std::__cxx11::string::_M_construct<char*>();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190.pathname_._M_dataplus._M_p != &local_190.pathname_.field_2) {
      operator_delete(local_190.pathname_._M_dataplus._M_p,
                      local_190.pathname_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170.pathname_._M_dataplus._M_p != paVar6) {
      operator_delete(local_170.pathname_._M_dataplus._M_p,
                      local_170.pathname_.field_2._M_allocated_capacity + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,CONCAT71(local_e0._M_allocated_capacity._1_7_,
                                        local_e0._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150.pathname_._M_dataplus._M_p != paVar4) {
      operator_delete(local_150.pathname_._M_dataplus._M_p,
                      local_150.pathname_.field_2._M_allocated_capacity + 1);
    }
    if (local_b0 == &local_a0) goto LAB_003ff091;
    local_190.pathname_.field_2._M_allocated_capacity =
         CONCAT44(local_a0._M_allocated_capacity._4_4_,local_a0._M_allocated_capacity._0_4_);
    _Var9._M_p = (pointer)local_b0;
  }
  else {
    __s = pcVar2 + 1;
    local_90 = &local_80;
    sVar3 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,__s,pcVar2 + sVar3 + 1);
    lVar1 = local_88;
    local_190.pathname_._M_dataplus._M_p = (pointer)local_90;
    if (local_90 == &local_80) {
      local_190.pathname_.field_2._8_8_ = local_80._8_8_;
      local_190.pathname_._M_dataplus._M_p = (pointer)&local_190.pathname_.field_2;
    }
    local_190.pathname_.field_2._M_allocated_capacity._1_7_ = local_80._M_allocated_capacity._1_7_;
    local_190.pathname_.field_2._M_local_buf[0] = local_80._M_local_buf[0];
    local_90 = &local_80;
    local_88 = 0;
    local_80._M_local_buf[0] = '\0';
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_190.pathname_._M_dataplus._M_p;
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_190.pathname_._M_dataplus._M_p;
    if (lVar1 != 0) {
      do {
        if ((paVar4 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_190.pathname_._M_dataplus._M_p || paVar6->_M_local_buf[0] != '/') ||
           (paVar4->_M_local_buf[-1] != '/')) {
          paVar4->_M_local_buf[0] = paVar6->_M_local_buf[0];
          paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(paVar4->_M_local_buf + 1);
        }
        paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(paVar6->_M_local_buf + 1);
      } while (paVar6 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(local_190.pathname_._M_dataplus._M_p + lVar1));
    }
    local_190.pathname_._M_string_length = (long)paVar4 - (long)local_190.pathname_._M_dataplus._M_p
    ;
    paVar4->_M_local_buf[0] = '\0';
    if (local_90 != &local_80) {
      operator_delete(local_90,CONCAT71(local_80._M_allocated_capacity._1_7_,
                                        local_80._M_local_buf[0]) + 1);
    }
    if ((local_190.pathname_._M_string_length == 0) ||
       (*local_190.pathname_._M_dataplus._M_p != '/')) {
      UnitTest::GetInstance();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,
                 ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
                 _M_dataplus._M_p,&local_191);
      sVar5 = local_c8;
      paVar4 = &local_170.pathname_.field_2;
      local_170.pathname_._M_dataplus._M_p = (pointer)paVar4;
      if (local_d0 == &local_c0) {
        local_170.pathname_.field_2._8_8_ = local_c0._8_8_;
      }
      else {
        local_170.pathname_._M_dataplus._M_p = (pointer)local_d0;
      }
      local_170.pathname_.field_2._M_allocated_capacity._1_7_ = local_c0._M_allocated_capacity._1_7_
      ;
      local_170.pathname_.field_2._M_local_buf[0] = local_c0._M_local_buf[0];
      local_170.pathname_._M_string_length = local_c8;
      local_d0 = &local_c0;
      local_c8 = 0;
      local_c0._M_local_buf[0] = '\0';
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_170.pathname_._M_dataplus._M_p;
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_170.pathname_._M_dataplus._M_p;
      if (sVar5 != 0) {
        do {
          if ((paVar6 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)local_170.pathname_._M_dataplus._M_p || paVar7->_M_local_buf[0] != '/')
             || (paVar6->_M_local_buf[-1] != '/')) {
            paVar6->_M_local_buf[0] = paVar7->_M_local_buf[0];
            paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(paVar6->_M_local_buf + 1);
            sVar5 = local_170.pathname_._M_string_length;
          }
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(paVar7->_M_local_buf + 1);
        } while (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)(local_170.pathname_._M_dataplus._M_p + sVar5));
      }
      local_170.pathname_._M_string_length =
           (long)paVar6 - (long)local_170.pathname_._M_dataplus._M_p;
      paVar6->_M_local_buf[0] = '\0';
      local_110 = &local_100;
      sVar3 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,__s,__s + sVar3);
      sVar5 = local_108;
      paVar6 = &local_130.pathname_.field_2;
      local_130.pathname_._M_dataplus._M_p = (pointer)paVar6;
      if (local_110 == &local_100) {
        local_130.pathname_.field_2._8_8_ = local_100._8_8_;
      }
      else {
        local_130.pathname_._M_dataplus._M_p = (pointer)local_110;
      }
      local_130.pathname_.field_2._M_allocated_capacity._1_7_ =
           local_100._M_allocated_capacity._1_7_;
      local_130.pathname_.field_2._M_local_buf[0] = local_100._M_local_buf[0];
      local_130.pathname_._M_string_length = local_108;
      local_110 = &local_100;
      local_108 = 0;
      local_100._M_local_buf[0] = '\0';
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_130.pathname_._M_dataplus._M_p;
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_130.pathname_._M_dataplus._M_p;
      if (sVar5 != 0) {
        do {
          if ((paVar7 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)local_130.pathname_._M_dataplus._M_p || paVar8->_M_local_buf[0] != '/')
             || (paVar7->_M_local_buf[-1] != '/')) {
            paVar7->_M_local_buf[0] = paVar8->_M_local_buf[0];
            paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(paVar7->_M_local_buf + 1);
            sVar5 = local_130.pathname_._M_string_length;
          }
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(paVar8->_M_local_buf + 1);
        } while (paVar8 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)(local_130.pathname_._M_dataplus._M_p + sVar5));
      }
      local_130.pathname_._M_string_length =
           (long)paVar7 - (long)local_130.pathname_._M_dataplus._M_p;
      paVar7->_M_local_buf[0] = '\0';
      FilePath::ConcatPaths(&local_150,&local_170,&local_130);
      std::__cxx11::string::operator=((string *)&local_190,(string *)&local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150.pathname_._M_dataplus._M_p != &local_150.pathname_.field_2) {
        operator_delete(local_150.pathname_._M_dataplus._M_p,
                        local_150.pathname_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130.pathname_._M_dataplus._M_p != paVar6) {
        operator_delete(local_130.pathname_._M_dataplus._M_p,
                        local_130.pathname_.field_2._M_allocated_capacity + 1);
      }
      if (local_110 != &local_100) {
        operator_delete(local_110,
                        CONCAT71(local_100._M_allocated_capacity._1_7_,local_100._M_local_buf[0]) +
                        1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170.pathname_._M_dataplus._M_p != paVar4) {
        operator_delete(local_170.pathname_._M_dataplus._M_p,
                        local_170.pathname_.field_2._M_allocated_capacity + 1);
      }
      if (local_d0 != &local_c0) {
        operator_delete(local_d0,CONCAT71(local_c0._M_allocated_capacity._1_7_,
                                          local_c0._M_local_buf[0]) + 1);
      }
      if (local_190.pathname_._M_string_length != 0) goto LAB_003feda2;
LAB_003fee4b:
      (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
      std::__cxx11::string::_M_construct<char*>();
    }
    else {
LAB_003feda2:
      if (local_190.pathname_._M_dataplus._M_p[local_190.pathname_._M_string_length - 1] != '/')
      goto LAB_003fee4b;
      GetCurrentExecutableName();
      GetOutputFormat_abi_cxx11_();
      FilePath::GenerateUniqueFileName
                (&local_150,&local_190,&local_170,local_130.pathname_._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130.pathname_._M_dataplus._M_p != &local_130.pathname_.field_2) {
        operator_delete(local_130.pathname_._M_dataplus._M_p,
                        local_130.pathname_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170.pathname_._M_dataplus._M_p != &local_170.pathname_.field_2) {
        operator_delete(local_170.pathname_._M_dataplus._M_p,
                        local_170.pathname_.field_2._M_allocated_capacity + 1);
      }
      (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
      std::__cxx11::string::_M_construct<char*>();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150.pathname_._M_dataplus._M_p != &local_150.pathname_.field_2) {
        operator_delete(local_150.pathname_._M_dataplus._M_p,
                        local_150.pathname_.field_2._M_allocated_capacity + 1);
      }
    }
    _Var9._M_p = local_190.pathname_._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190.pathname_._M_dataplus._M_p == &local_190.pathname_.field_2) goto LAB_003ff091;
  }
  operator_delete(_Var9._M_p,local_190.pathname_.field_2._M_allocated_capacity + 1);
LAB_003ff091:
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return in_RDI;
}

Assistant:

std::string UnitTestOptions::GetAbsolutePathToOutputFile() {
  std::string s = GTEST_FLAG_GET(output);
  const char* const gtest_output_flag = s.c_str();

  std::string format = GetOutputFormat();
  if (format.empty()) format = std::string(kDefaultOutputFormat);

  const char* const colon = strchr(gtest_output_flag, ':');
  if (colon == nullptr)
    return internal::FilePath::MakeFileName(
               internal::FilePath(
                   UnitTest::GetInstance()->original_working_dir()),
               internal::FilePath(kDefaultOutputFile), 0, format.c_str())
        .string();

  internal::FilePath output_name(colon + 1);
  if (!output_name.IsAbsolutePath())
    output_name = internal::FilePath::ConcatPaths(
        internal::FilePath(UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(colon + 1));

  if (!output_name.IsDirectory()) return output_name.string();

  internal::FilePath result(internal::FilePath::GenerateUniqueFileName(
      output_name, internal::GetCurrentExecutableName(),
      GetOutputFormat().c_str()));
  return result.string();
}